

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::reserve(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
          *this,size_type n,size_type avg_size,size_type max_align)

{
  size_type sVar1;
  length_error *this_00;
  bool bVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  ulong local_40;
  ulong local_38;
  size_type max_align_local;
  size_type avg_size_local;
  size_type n_local;
  vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
  *this_local;
  
  pVar3 = capacities(this);
  local_38 = pVar3.first;
  bVar2 = false;
  if (n <= local_38) {
    pVar3 = capacities(this);
    local_40 = pVar3.second;
    bVar2 = false;
    if (avg_size <= local_40) {
      bVar2 = max_align <= this->_align_max;
    }
  }
  if (!bVar2) {
    sVar1 = max_size(this);
    if (sVar1 < n) {
      this_00 = (length_error *)__cxa_allocate_exception(0x10);
      std::length_error::length_error(this_00,"poly::vector reserve size too big");
      __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
    }
    vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
    ::increase_storage<std::integral_constant<bool,false>>
              ((vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
                *)this,n,avg_size,max_align);
  }
  return;
}

Assistant:

inline void vector<I, A, C>::reserve(size_type n, size_type avg_size, size_type max_align)
{
    using copy = std::conditional_t<interface_type_noexcept_movable::value, std::false_type,
        std::true_type>;
    if (n <= capacities().first && avg_size <= capacities().second && _align_max >= max_align) {
        return;
    }
    if (n > max_size()) {
        throw std::length_error("poly::vector reserve size too big");
    }
    increase_storage(n, avg_size, max_align, copy {});
}